

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<11,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Matrix<float,_3,_2> *mat;
  Matrix<float,_3,_2> *mat_00;
  long lVar7;
  undefined4 *puVar8;
  undefined4 uVar9;
  Type in0;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_3> res_2;
  undefined8 local_98;
  float fStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  float fStack_84;
  float local_80 [4];
  float local_70 [4];
  float local_60 [4];
  int local_50 [6];
  Matrix<float,_3,_2> local_38;
  Matrix<float,_3,_2> local_20;
  
  puVar2 = &local_98;
  puVar3 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar7) = uVar9;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 == 0xc);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_90 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_84 = evalCtx->in[1].m_data[2];
    uStack_8c = (undefined4)uVar1;
    uStack_88 = (undefined4)((ulong)uVar1 >> 0x20);
    mat = (Matrix<float,_3,_2> *)0x3;
  }
  else {
    local_98 = 0;
    fStack_90 = 0.0;
    uStack_8c = 0;
    uStack_88 = 0;
    fStack_84 = 0.0;
    puVar5 = &s_constInMat2x3;
    mat = (Matrix<float,_3,_2> *)0x0;
    do {
      lVar4 = 0;
      puVar8 = (undefined4 *)puVar3;
      do {
        *puVar8 = puVar5[lVar4];
        lVar4 = lVar4 + 1;
        puVar8 = puVar8 + 3;
      } while (lVar4 == 1);
      mat = (Matrix<float,_3,_2> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 2;
    } while (mat != (Matrix<float,_3,_2> *)0x3);
  }
  increment<float,3,2>(&local_20,(MatrixCaseUtils *)&local_98,mat);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar4 = 0;
  do {
    local_70[lVar4] =
         local_20.m_data.m_data[0].m_data[lVar4] + local_20.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  increment<float,3,2>(&local_38,(MatrixCaseUtils *)&local_98,mat_00);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar4 = 0;
  do {
    local_80[lVar4] =
         local_38.m_data.m_data[0].m_data[lVar4] + local_38.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar4 = 0;
  do {
    local_70[lVar4 + 4] = local_70[lVar4] + local_80[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar4]] = local_70[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}